

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.c
# Opt level: O3

logical pnga_create_bin_range(Integer g_bin,Integer g_cnt,Integer g_off,Integer *g_range)

{
  long lVar1;
  bool bVar2;
  Integer proc;
  Integer IVar3;
  logical lVar4;
  ulong uVar5;
  undefined4 *buf;
  ulong uVar6;
  long lVar7;
  Integer hibin;
  Integer hi;
  Integer lo;
  Integer *myoff;
  Integer last_proc;
  Integer lobin;
  Integer first_proc;
  Integer type;
  Integer thi [2];
  Integer tlo [2];
  Integer crap;
  Integer nbin;
  Integer ndim;
  Integer chunk [2];
  Integer dims [2];
  ulong local_118;
  long local_110;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  long local_f8;
  long local_f0;
  long *local_e8;
  Integer local_e0;
  Integer *local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  Integer local_b8;
  Integer local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  Integer local_70;
  Integer local_68;
  long local_60;
  Integer local_58 [5];
  
  local_d8 = g_range;
  local_b8 = g_cnt;
  proc = pnga_nodeid();
  IVar3 = pnga_nnodes();
  pnga_inquire(g_bin,&local_a0,&local_60,&local_68);
  if (local_60 != 1) {
    pnga_error("ga_bin_index: 1-dim array required",local_60);
  }
  if ((0xf < local_a0 - 0x3e9U) || ((0x8003UL >> (local_a0 - 0x3e9U & 0x3f) & 1) == 0)) {
    pnga_error("ga_bin_index: not integer type",local_a0);
  }
  local_58[2] = 2;
  local_58[0] = 2;
  local_58[1] = 1;
  local_58[3] = IVar3;
  lVar4 = pnga_create(0x3f2,2,local_58 + 2,"bin_proc",local_58,local_d8);
  if (lVar4 == 0) {
    lVar4 = 0;
  }
  else {
    pnga_distribution(g_off,proc,&local_c0,&local_110);
    lVar4 = 1;
    if (0 < local_c0) {
      pnga_access_ptr(g_off,&local_c0,&local_110,&local_e8,&local_70);
      local_b0 = *local_e8 + 1;
      local_d0 = local_e8[local_110 - local_c0] + 1;
      lVar4 = pnga_locate(g_bin,&local_b0,&local_a8);
      if (lVar4 == 0) {
        pnga_error("ga_bin_sorter: failed to locate region f",local_b0);
      }
      lVar4 = pnga_locate(g_bin,&local_d0,&local_c8);
      if (lVar4 == 0) {
        pnga_error("ga_bin_sorter: failed to locate region l",local_d0);
      }
      if (local_a8 <= local_c8) {
        lVar7 = local_a8;
        local_e0 = g_bin;
        do {
          local_108 = 0xffffffff;
          uStack_104 = 0xffffffff;
          uStack_100 = 0xffffffff;
          uStack_fc = 0xffffffff;
          pnga_distribution(local_e0,lVar7,&local_f0,&local_f8);
          if (local_c0 <= local_110) {
            lVar1 = *local_e8;
            lVar7 = lVar1 + 1;
            if (local_c0 != local_110) {
              uVar5 = (ulong)(lVar7 == local_f0);
              uVar6 = uVar5 + 2;
              if (local_e8[1] != local_f8) {
                uVar6 = uVar5;
              }
              lVar4 = (*(code *)(&DAT_001b4350 + *(int *)(&DAT_001b4350 + uVar6 * 4)))();
              return lVar4;
            }
            pnga_get(local_b8,&local_110,&local_110,&local_118,&local_110);
            uVar5 = (ulong)(lVar7 == local_f0);
            uVar6 = uVar5 + 2;
            if (lVar1 + local_118 != local_f8) {
              uVar6 = uVar5;
            }
            lVar4 = (*(code *)(&DAT_001b4350 + *(int *)(&DAT_001b4350 + uVar6 * 4)))();
            return lVar4;
          }
          lVar1 = CONCAT44(uStack_104,local_108);
          local_118 = (ulong)(lVar1 != -1);
          if (CONCAT44(uStack_fc,uStack_100) == -1) {
            uVar6 = 1;
            if (lVar1 != -1) goto LAB_0013a71e;
          }
          else {
            uVar6 = (ulong)(lVar1 != -1) + 1;
            local_118 = uVar6;
LAB_0013a71e:
            local_90 = lVar7 + 1;
            buf = &uStack_100;
            if (lVar1 != -1) {
              buf = &local_108;
            }
            local_f0 = (ulong)(lVar1 == -1) + 1;
            local_f8 = (lVar1 == -1) + uVar6;
            local_98 = local_f8;
            local_88 = local_f0;
            local_80 = local_90;
            pnga_put(*local_d8,&local_88,&local_98,buf,(Integer *)&local_118);
          }
          bVar2 = lVar7 < local_c8;
          lVar7 = lVar7 + 1;
        } while (bVar2);
      }
      lVar4 = 1;
    }
  }
  return lVar4;
}

Assistant:

logical pnga_create_bin_range(Integer g_bin, Integer g_cnt, Integer g_off, Integer *g_range)
{
Integer type, ndim, nbin, lobin, hibin, me=pnga_nodeid(),crap;
Integer dims[2], nproc=pnga_nnodes(),chunk[2];
Integer tlo[2], thi[2];

    pnga_inquire(g_bin, &type, &ndim, &nbin);
    if(ndim !=1) pnga_error("ga_bin_index: 1-dim array required",ndim);
    if(type!= C_INT && type!=C_LONG && type!=C_LONGLONG)
       pnga_error("ga_bin_index: not integer type",type);

    chunk[0]=dims[0]=2; dims[1]=nproc; chunk[1]=1;
    if(!pnga_create(MT_F_INT, 2, dims, "bin_proc",chunk,g_range)) return FALSE;

    pnga_distribution(g_off,me, &lobin,&hibin);

    if(lobin>0){ /* enter this block when we have data */
      Integer first_proc, last_proc, p;
      Integer first_off, last_off;
      Integer *myoff, bin;

      /* get offset values stored on my processor to first and last bin */
      pnga_access_ptr(g_off, &lobin, &hibin, &myoff, &crap);
      first_off = myoff[0]; last_off = myoff[hibin-lobin];
/*
      pnga_get(g_off,&lobin,&lobin,&first_off,&lo);
      pnga_get(g_off,&hibin,&hibin,&last_off,&hi);
*/

      /* since offset starts at 0, add 1 to get index to g_bin */
      first_off++; last_off++;

      /* find processors on which these bins are located */
      if(!pnga_locate(g_bin, &first_off, &first_proc))
          pnga_error("ga_bin_sorter: failed to locate region f",first_off);
      if(!pnga_locate(g_bin, &last_off, &last_proc))
          pnga_error("ga_bin_sorter: failed to locate region l",last_off);

      /* inspect range of indices to bin elements stored on these processors */
      for(p=first_proc, bin=lobin; p<= last_proc; p++){
          Integer lo, hi, buf[2], off, cnt; 
          buf[0] =-1; buf[1]=-1;

          pnga_distribution(g_bin,p,&lo,&hi);

          for(/* start from current bin */; bin<= hibin; bin++, myoff++){ 
              Integer blo,bhi,stat;

              blo = *myoff +1;
              if(bin == hibin){
                 pnga_get(g_cnt, &hibin, &hibin, &cnt, &hibin); /* local */
                 bhi = blo + cnt-1; 
              }else
                 bhi = myoff[1]; 

              stat= sgai_match_bin2proc(blo, bhi, lo, hi);

              switch (stat) {
              case 0:  /* bin in a middle */ break;
              case 1:  /* first bin on that processor */
                       buf[0] =bin; break;
              case 2:  /* last bin on that processor */
                       buf[1] =bin; break;
              case 3:  /* first and last bin on that processor */
                       buf[0] =bin; buf[1] =bin; break;
              }

              if(stat>1)break; /* found last bin on that processor */
          }
          
          /* set range of bins on processor p */
          cnt =0; off=1;
          if(buf[0]!=-1){cnt=1; off=0;} 
          if(buf[1]!=-1)cnt++; 
          if(cnt){
                 Integer p1 = p+1;
                 lo = 1+off; hi = lo+cnt-1;
                 tlo[0] = lo;
                 tlo[1] = p1;
                 thi[0] = hi;
                 thi[1] = p1;
                 pnga_put(*g_range, tlo, thi, buf+off, &cnt);
          }
      }
   }
   return TRUE;
}